

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)

{
  pointer plVar1;
  pointer plVar2;
  loader_impl_ext_handle_lib_type ext;
  
  plVar1 = (ext_handle->extensions).
           super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (plVar2 = (ext_handle->extensions).
                super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
                ._M_impl.super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    loader_impl_ext_handle_lib_type::loader_impl_ext_handle_lib_type(&ext,plVar2);
    if (ext.handle != (dynlink)0x0) {
      dynlink_unload();
    }
    std::__cxx11::string::~string((string *)&ext);
  }
  std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
  ~vector(&ext_handle->extensions);
  operator_delete(ext_handle,0x18);
  return;
}

Assistant:

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)
{
	for (auto ext : ext_handle->extensions)
	{
		if (ext.handle != NULL)
		{
			dynlink_unload(ext.handle);
		}
	}

	delete ext_handle;
}